

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

size_t dictionary_text_get_all_match_lengths
                 (dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  ucs4_t **ppuVar1;
  void *pvVar2;
  entry *brs;
  entry buff;
  size_t len;
  size_t length;
  size_t rscnt;
  text_dictionary_desc *text_dictionary;
  size_t *match_length_local;
  ucs4_t *word_local;
  dictionary_t t_dictionary_local;
  
  length = 0;
  if (*t_dictionary == 0) {
    t_dictionary_local = (dictionary_t)0x0;
  }
  else {
    ppuVar1 = (ucs4_t **)ucs4len(word);
    buff.value = *(ucs4_t ***)((long)t_dictionary + 8);
    if (ppuVar1 < *(ucs4_t ***)((long)t_dictionary + 8)) {
      buff.value = ppuVar1;
    }
    ucs4ncpy(*(ucs4_t **)((long)t_dictionary + 0x18),word,(size_t)buff.value);
    *(undefined4 *)(*(long *)((long)t_dictionary + 0x18) + (long)buff.value * 4) = 0;
    brs = *(entry **)((long)t_dictionary + 0x18);
    for (; buff.value != (ucs4_t **)0x0; buff.value = (ucs4_t **)((long)buff.value + -1)) {
      *(undefined4 *)(*(long *)((long)t_dictionary + 0x18) + (long)buff.value * 4) = 0;
      pvVar2 = bsearch(&brs,*(void **)((long)t_dictionary + 0x10),*t_dictionary,0x10,qsort_entry_cmp
                      );
      if (pvVar2 != (void *)0x0) {
        match_length[length] = (size_t)buff.value;
        length = length + 1;
      }
    }
    t_dictionary_local = (dictionary_t)length;
  }
  return (size_t)t_dictionary_local;
}

Assistant:

size_t dictionary_text_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t rscnt = 0;

	if (text_dictionary->entry_count == 0)
		return rscnt;

	size_t length = ucs4len(word);
	size_t len = text_dictionary->max_length;
	if (length < len)
		len = length;

	ucs4ncpy(text_dictionary->word_buff, word, len);
	text_dictionary->word_buff[len] = L'\0';

	entry buff;
	buff.key = text_dictionary->word_buff;

	for (; len > 0; len --)
	{
		text_dictionary->word_buff[len] = L'\0';
		entry * brs = (entry *) bsearch(
				&buff,
				text_dictionary->lexicon,
				text_dictionary->entry_count,
				sizeof(text_dictionary->lexicon[0]),
				qsort_entry_cmp
		);

		if (brs != NULL)
			match_length[rscnt ++] = len;
	}

	return rscnt;
}